

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::DescriptorDatabaseTest_ConflictingTypeError_Test::
DescriptorDatabaseTest_ConflictingTypeError_Test
          (DescriptorDatabaseTest_ConflictingTypeError_Test *this)

{
  DescriptorDatabaseTest_ConflictingTypeError_Test *this_local;
  
  DescriptorDatabaseTest::DescriptorDatabaseTest(&this->super_DescriptorDatabaseTest);
  (this->super_DescriptorDatabaseTest).
  super_TestWithParam<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*)()>.
  super_Test._vptr_Test =
       (_func_int **)&PTR__DescriptorDatabaseTest_ConflictingTypeError_Test_029a4140;
  (this->super_DescriptorDatabaseTest).
  super_TestWithParam<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*)()>.
  super_WithParamInterface<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*)()>
  ._vptr_WithParamInterface =
       (_func_int **)&PTR__DescriptorDatabaseTest_ConflictingTypeError_Test_029a4180;
  return;
}

Assistant:

TEST_P(DescriptorDatabaseTest, ConflictingTypeError) {
  AddToDatabase(
      "name: \"foo.proto\" "
      "message_type { "
      "  name: \"Foo\" "
      "}");
  AddToDatabaseWithError(
      "name: \"bar.proto\" "
      "message_type { "
      "  name: \"Foo\" "
      "}");
}